

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qvariantanimation.cpp
# Opt level: O3

void QVariantAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QVariant *pQVar1;
  PrivateShared *pPVar2;
  int iVar3;
  QBindableInterface *pQVar4;
  parameter_type other;
  long *plVar5;
  QVariantAnimationPrivate *pQVar6;
  long in_FS_OFFSET;
  qreal qVar7;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_48._8_8_ = _a[1];
    local_48.shared = (PrivateShared *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_48.shared);
  }
  switch(_c) {
  case ReadProperty:
    if (4 < (uint)_id) break;
    pQVar1 = (QVariant *)*_a;
    switch(_id) {
    case 0:
      pQVar6 = (QVariantAnimationPrivate *)(_o->d_ptr).d;
      qVar7 = 0.0;
      break;
    case 1:
      pQVar6 = (QVariantAnimationPrivate *)(_o->d_ptr).d;
      qVar7 = 1.0;
      break;
    case 2:
      currentValue((QVariant *)&local_48,(QVariantAnimation *)_o);
      ::QVariant::operator=(pQVar1,(QVariant *)&local_48);
      goto LAB_003b0fe9;
    case 3:
      iVar3 = (*_o->_vptr_QObject[0xc])(_o);
      *(int *)&(pQVar1->d).data = iVar3;
      goto switchD_003b0e69_caseD_3;
    case 4:
      other = QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
                       *)&(_o->d_ptr).d[3].bindingStorage);
      QEasingCurve::QEasingCurve((QEasingCurve *)&local_48.shared,other);
      pPVar2 = (pQVar1->d).data.shared;
      (pQVar1->d).data.shared = local_48.shared;
      local_48.shared = pPVar2;
      QEasingCurve::~QEasingCurve((QEasingCurve *)&local_48.shared);
      goto switchD_003b0e69_caseD_3;
    }
    QVariantAnimationPrivate::valueAt((QVariant *)&local_48,pQVar6,qVar7);
    ::QVariant::operator=(pQVar1,(QVariant *)&local_48);
LAB_003b0fe9:
    ::QVariant::~QVariant((QVariant *)&local_48);
    break;
  case WriteProperty:
    if (4 < (uint)_id) break;
    pQVar1 = (QVariant *)*_a;
    switch(_id) {
    case 0:
      pQVar6 = (QVariantAnimationPrivate *)(_o->d_ptr).d;
      qVar7 = 0.0;
      goto LAB_003b0f4f;
    case 1:
      pQVar6 = (QVariantAnimationPrivate *)(_o->d_ptr).d;
      qVar7 = 1.0;
LAB_003b0f4f:
      QVariantAnimationPrivate::setValueAt(pQVar6,qVar7,pQVar1);
      break;
    case 3:
      setDuration((QVariantAnimation *)_o,*(int *)&(pQVar1->d).data);
      break;
    case 4:
      setEasingCurve((QVariantAnimation *)_o,(QEasingCurve *)pQVar1);
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == valueChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    break;
  case BindableProperty:
    if (_id == 4) {
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[3].bindingStorage;
      pQVar4 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>,_void>
                ::iface;
    }
    else {
      if (_id != 3) break;
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[3].bindingStorage.bindingStatus;
      pQVar4 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>,_void>
                ::iface;
    }
    plVar5[1] = (long)pQVar4;
  }
switchD_003b0e69_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QVariantAnimation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QVariantAnimation::*)(const QVariant & )>(_a, &QVariantAnimation::valueChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVariant*>(_v) = _t->startValue(); break;
        case 1: *reinterpret_cast<QVariant*>(_v) = _t->endValue(); break;
        case 2: *reinterpret_cast<QVariant*>(_v) = _t->currentValue(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        case 4: *reinterpret_cast<QEasingCurve*>(_v) = _t->easingCurve(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setStartValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 1: _t->setEndValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 3: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setEasingCurve(*reinterpret_cast<QEasingCurve*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableEasingCurve(); break;
        default: break;
        }
    }
}